

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_249e1e::ImageOptimizer::evaluate(ImageOptimizer *this,string *description)

{
  QPDFJob *pQVar1;
  bool bVar2;
  element_type *p_00;
  longlong lVar3;
  qpdf_offset_t qVar4;
  anon_class_24_3_a4d22452 local_188;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_170;
  anon_class_8_1_aac66e5c local_150;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_148;
  allocator<char> local_121;
  string local_120 [32];
  string local_100;
  long local_e0;
  longlong orig_length;
  undefined1 local_d0 [8];
  shared_ptr<Pipeline> p;
  Pl_Count c;
  Pl_Discard d;
  anon_class_8_1_aac66e5c local_48;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  Pipeline *local_20;
  string *description_local;
  ImageOptimizer *this_local;
  
  local_20 = (Pipeline *)description;
  description_local = (string *)this;
  bVar2 = QPDFObjectHandle::pipeStreamData
                    (&this->image,(Pipeline *)0x0,0,this->decode_level,true,false);
  if (bVar2) {
    Pl_Discard::Pl_Discard((Pl_Discard *)&c.m);
    Pl_Count::Pl_Count((Pl_Count *)
                       &p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       "count",(Pipeline *)&c.m);
    makePipeline((ImageOptimizer *)local_d0,(string *)this,local_20);
    bVar2 = std::operator==((shared_ptr<Pipeline> *)local_d0,(nullptr_t)0x0);
    if (bVar2) {
      this_local._7_1_ = 0;
    }
    else {
      p_00 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
      bVar2 = QPDFObjectHandle::pipeStreamData(&this->image,p_00,0,this->decode_level,false,false);
      if (bVar2) {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_100);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_120,"/Length",&local_121);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_100.field_2,&local_100);
        lVar3 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_100.field_2);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_100.field_2);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator(&local_121);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_100);
        local_e0 = lVar3;
        qVar4 = Pl_Count::getCount((Pl_Count *)
                                   &p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
        if (qVar4 < local_e0) {
          pQVar1 = this->o;
          local_188.description = (string *)local_20;
          local_188.orig_length = &local_e0;
          local_188.c = (Pl_Count *)
                        &p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          std::function<void(Pipeline&,std::__cxx11::string_const&)>::
          function<(anonymous_namespace)::ImageOptimizer::evaluate(std::__cxx11::string_const&)::__2,void>
                    ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_170,&local_188)
          ;
          QPDFJob::doIfVerbose(pQVar1,&local_170);
          std::
          function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_170);
          this_local._7_1_ = 1;
        }
        else {
          QTC::TC("qpdf","QPDFJob image optimize no shrink",0);
          pQVar1 = this->o;
          local_150.description = (string *)local_20;
          std::function<void(Pipeline&,std::__cxx11::string_const&)>::
          function<(anonymous_namespace)::ImageOptimizer::evaluate(std::__cxx11::string_const&)::__1,void>
                    ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_148,&local_150)
          ;
          QPDFJob::doIfVerbose(pQVar1,&local_148);
          std::
          function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_148);
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    orig_length._4_4_ = 1;
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_d0);
    Pl_Count::~Pl_Count((Pl_Count *)
                        &p.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Pl_Discard::~Pl_Discard((Pl_Discard *)&c.m);
  }
  else {
    QTC::TC("qpdf","QPDFJob image optimize no pipeline",0);
    pQVar1 = this->o;
    local_48.description = (string *)local_20;
    std::function<void(Pipeline&,std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::ImageOptimizer::evaluate(std::__cxx11::string_const&)::__0,void>
              ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_40,&local_48);
    QPDFJob::doIfVerbose(pQVar1,&local_40);
    std::
    function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_40);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
ImageOptimizer::evaluate(std::string const& description)
{
    // Note: passing nullptr as pipeline (first argument) just tests whether we can filter.
    if (!image.pipeStreamData(nullptr, 0, decode_level, true)) {
        QTC::TC("qpdf", "QPDFJob image optimize no pipeline");
        o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": " << description
              << ": not optimizing because unable to decode data or data already uses DCT\n";
        });
        return false;
    }
    Pl_Discard d;
    Pl_Count c("count", &d);
    std::shared_ptr<Pipeline> p = makePipeline(description, &c);
    if (p == nullptr) {
        // message issued by makePipeline
        return false;
    }
    if (!image.pipeStreamData(p.get(), 0, decode_level)) {
        return false;
    }
    long long orig_length = image.getDict().getKey("/Length").getIntValue();
    if (c.getCount() >= orig_length) {
        QTC::TC("qpdf", "QPDFJob image optimize no shrink");
        o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": " << description
              << ": not optimizing because DCT compression does not reduce image size\n";
        });
        return false;
    }
    o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": " << description << ": optimizing image reduces size from " << orig_length
          << " to " << c.getCount() << "\n";
    });
    return true;
}